

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgaimage.cpp
# Opt level: O0

TGAColor __thiscall TGAImage::get(TGAImage *this,size_t x,size_t y)

{
  TGAColor TVar1;
  size_type sVar2;
  uchar *puVar3;
  size_t y_local;
  size_t x_local;
  TGAImage *this_local;
  
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->data);
  if (((sVar2 == 0) || (this->width <= x)) || (this->height <= y)) {
    memset((void *)((long)&this_local + 3),0,5);
    TGAColor::TGAColor((TGAColor *)((long)&this_local + 3));
  }
  else {
    puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->data);
    TGAColor::TGAColor((TGAColor *)((long)&this_local + 3),
                       puVar3 + (x + y * this->width) * (ulong)this->bytespp,(uint8_t)this->bytespp)
    ;
  }
  TVar1.bytespp = this_local._7_1_;
  TVar1.bgra[0] = this_local._3_1_;
  TVar1.bgra[1] = this_local._4_1_;
  TVar1.bgra[2] = this_local._5_1_;
  TVar1.bgra[3] = this_local._6_1_;
  return TVar1;
}

Assistant:

TGAColor TGAImage::get(const size_t x, const size_t y) const
{
    if (!data.size() || x < 0 || y < 0 || x >= width || y >= height) return {};
    return TGAColor(data.data() + (x + y * width) * bytespp, bytespp);
}